

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O2

void __thiscall pg::FPISolver::freezeThawReset(FPISolver *this,int i,int n,int p)

{
  ulong *puVar1;
  uint uVar2;
  int *piVar3;
  uint64_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  ostream *poVar7;
  ulong uVar8;
  char *pcVar9;
  byte bVar10;
  ulong uVar11;
  bool bVar12;
  _label_vertex local_40;
  
  uVar11 = (ulong)i;
  do {
    bVar12 = n == 0;
    n = n + -1;
    if (bVar12) {
      return;
    }
    uVar6 = uVar11 >> 6;
    if ((((this->super_Solver).disabled)->_bits[uVar6] >> (uVar11 & 0x3f) & 1) == 0) {
      piVar3 = this->frozen;
      uVar2 = piVar3[uVar11];
      if ((int)uVar2 < p) {
        uVar8 = 1L << (uVar11 & 0x3f);
        if (uVar2 == 0) {
          puVar4 = (this->distraction)._bits;
          uVar5 = puVar4[uVar6];
          bVar10 = ((this->parity)._bits[uVar6] & uVar8) != 0 ^ (byte)p;
          if ((uVar5 & uVar8) == 0) {
            if ((bVar10 & 1) != 0) goto LAB_00156501;
          }
          else if ((bVar10 & 1) == 0) {
LAB_00156501:
            piVar3[uVar11] = p;
            if (1 < (this->super_Solver).trace) {
              poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[38;5;51;1mfreeze\x1b[m ");
              local_40.g = (this->super_Solver).game;
              local_40.v = (int)uVar11;
              poVar7 = operator<<(poVar7,&local_40);
              poVar7 = std::operator<<(poVar7," at priority ");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,p);
              goto LAB_0015654e;
            }
          }
          else {
            puVar4[uVar6] = ~uVar8 & uVar5;
            if (1 < (this->super_Solver).trace) {
              poVar7 = (this->super_Solver).logger;
              pcVar9 = "\x1b[31;1mresetting\x1b[m ";
              goto LAB_001564db;
            }
          }
        }
        else if (((uVar2 ^ p) & 1) == 0) {
          piVar3[uVar11] = p;
        }
        else {
          piVar3[uVar11] = 0;
          puVar1 = (this->distraction)._bits + uVar6;
          *puVar1 = *puVar1 & ~uVar8;
          if (1 < (this->super_Solver).trace) {
            poVar7 = (this->super_Solver).logger;
            pcVar9 = "\x1b[38;5;202;1mthaw\x1b[m ";
LAB_001564db:
            poVar7 = std::operator<<(poVar7,pcVar9);
            local_40.g = (this->super_Solver).game;
            local_40.v = (int)uVar11;
            poVar7 = operator<<(poVar7,&local_40);
LAB_0015654e:
            std::endl<char,std::char_traits<char>>(poVar7);
          }
        }
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void
FPISolver::freezeThawReset(int i, int n, int p)
{
    const int pl = p&1;
    for (; n != 0; i++, n--) {
        if (disabled[i]) continue; // not in the subgame
        if (frozen[i] >= p) continue; // already frozen

        if (frozen[i]) {
            if ((frozen[i]&1) == pl) {
                frozen[i] = p;
            } else {
                frozen[i] = 0;
                distraction[i] = 0;
#ifndef NDEBUG
                if (trace >= 2) logger << "\033[38;5;202;1mthaw\033[m " << label_vertex(i) << std::endl;
#endif
            }
        } else if (distraction[i]) {
            if (parity[i] == pl) {
                frozen[i] = p;
#ifndef NDEBUG
                if (trace >= 2) logger << "\033[38;5;51;1mfreeze\033[m " << label_vertex(i) << " at priority " << p << std::endl;
#endif
            } else {
                distraction[i] = 0;
#ifndef NDEBUG
                if (trace >= 2) logger << "\033[31;1mresetting\033[m " << label_vertex(i) << std::endl;
#endif
            }
        } else if (parity[i] != pl) {
            frozen[i] = p;
#ifndef NDEBUG
            if (trace >= 2) logger << "\033[38;5;51;1mfreeze\033[m " << label_vertex(i) << " at priority " << p << std::endl;
#endif
        }
    }
}